

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall
presolve::HPresolve::rowCoefficientsIntegral(HPresolve *this,HighsInt row,double scale)

{
  double *pdVar1;
  int node;
  HighsInt HVar2;
  double dVar3;
  iterator __begin1;
  iterator local_68;
  double local_28;
  undefined8 uStack_20;
  
  node = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[row];
  if (node == -1) {
    local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.nodeLeft = (HighsInt *)0x0;
    local_68.nodeRight = (HighsInt *)0x0;
    local_68.pos_.index_ = (HighsInt *)0x0;
    local_68.pos_.value_ = (double *)0x0;
    local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68.currentNode = -1;
  }
  else {
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
              (&local_68,
               (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,node);
  }
  while (HVar2 = local_68.currentNode, local_68.currentNode != -1) {
    local_28 = *local_68.pos_.value_ * scale;
    uStack_20 = 0;
    dVar3 = round(local_28);
    pdVar1 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
    if (*pdVar1 <= ABS(local_28 - dVar3) && ABS(local_28 - dVar3) != *pdVar1) break;
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_68);
  }
  if (local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar2 == -1;
}

Assistant:

bool HPresolve::rowCoefficientsIntegral(HighsInt row, double scale) const {
  for (const HighsSliceNonzero& nz : getRowVector(row)) {
    if (fractionality(nz.value() * scale) > options->small_matrix_value)
      return false;
  }

  return true;
}